

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     UniversalPrinter<google::protobuf::internal::TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL>_*>::Print
               (TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL> **value,ostream *os)

{
  ostream *os_local;
  TcParseTable<0UL,_3UL,_0UL,_0UL,_2UL> **value_local;
  
  PrintTo<google::protobuf::internal::TcParseTable<0ul,3ul,0ul,0ul,2ul>*>(value,os);
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }